

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall Rml::BaseXMLParser::PeekString(BaseXMLParser *this,char *string,bool consume)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  char x;
  int local_34;
  char c;
  int i;
  bool success;
  int start_line;
  size_t start_index;
  bool consume_local;
  char *string_local;
  BaseXMLParser *this_local;
  
  sVar2 = this->xml_index;
  iVar1 = this->line_number;
  bVar3 = true;
  local_34 = 0;
  do {
    if (string[local_34] == '\0') {
LAB_004ba632:
      if ((!consume) || (bVar3 == false)) {
        this->xml_index = sVar2;
        this->line_number = iVar1;
      }
      return bVar3;
    }
    bVar4 = AtEnd(this);
    if (bVar4) {
      bVar3 = false;
      goto LAB_004ba632;
    }
    x = Look(this);
    if (x == '\n') {
      this->line_number = this->line_number + 1;
    }
    if ((local_34 == 0) && (bVar4 = StringUtilities::IsWhitespace(x), bVar4)) {
      Next(this);
    }
    else {
      if (x != string[local_34]) {
        bVar3 = false;
        goto LAB_004ba632;
      }
      local_34 = local_34 + 1;
      Next(this);
    }
  } while( true );
}

Assistant:

bool BaseXMLParser::PeekString(const char* string, bool consume)
{
	const size_t start_index = xml_index;
	const int start_line = line_number;
	bool success = true;
	int i = 0;
	while (string[i])
	{
		if (AtEnd())
		{
			success = false;
			break;
		}

		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Seek past all the whitespace if we haven't hit the initial character yet.
		if (i == 0 && StringUtilities::IsWhitespace(c))
		{
			Next();
		}
		else
		{
			if (c != string[i])
			{
				success = false;
				break;
			}

			i++;
			Next();
		}
	}

	// Set the index to the start index unless we are consuming.
	if (!consume || !success)
	{
		xml_index = start_index;
		line_number = start_line;
	}

	return success;
}